

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cport.cc
# Opt level: O1

string * rcg::anon_unknown_3::toLower
                   (string *__return_storage_ptr__,string *s,size_t start,size_t size)

{
  int iVar1;
  ulong uVar2;
  ostringstream out;
  char local_1a9;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  uVar2 = size + start;
  if (s->_M_string_length <= size + start) {
    uVar2 = s->_M_string_length;
  }
  if (start < uVar2) {
    do {
      iVar1 = tolower((int)(s->_M_dataplus)._M_p[start]);
      local_1a9 = (char)iVar1;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,&local_1a9,1);
      start = start + 1;
    } while (uVar2 != start);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

inline std::string toLower(const std::string &s, size_t start, size_t size)
{
  std::ostringstream out;

  size_t end=std::min(s.size(), start+size);

  while (start < end)
  {
    out << static_cast<char>(std::tolower(s[start++]));
  }

  return out.str();
}